

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# dec_sse2.c
# Opt level: O3

void DC16NoTop_SSE2(uint8_t *dst)

{
  uint8_t *puVar1;
  byte bVar2;
  int DC;
  uint uVar3;
  long lVar4;
  undefined4 uVar5;
  undefined1 uVar7;
  undefined1 uVar8;
  undefined1 auVar6 [16];
  
  DC = 8;
  lVar4 = -1;
  do {
    DC = DC + (uint)dst[lVar4];
    lVar4 = lVar4 + 0x20;
  } while (lVar4 != 0x1ff);
  uVar3 = (uint)DC >> 4;
  bVar2 = (byte)((uint)DC >> 0x18);
  uVar8 = (undefined1)(uVar3 >> 0x10);
  uVar7 = (undefined1)(uVar3 >> 8);
  auVar6._4_4_ = (int)(CONCAT35(CONCAT21(CONCAT11(bVar2 >> 4,bVar2 >> 4),uVar8),
                                CONCAT14(uVar8,uVar3)) >> 0x20);
  auVar6[3] = uVar7;
  auVar6[2] = uVar7;
  auVar6[0] = (undefined1)uVar3;
  auVar6[1] = auVar6[0];
  auVar6._8_8_ = 0;
  auVar6 = pshuflw(auVar6,auVar6,0);
  uVar5 = auVar6._0_4_;
  lVar4 = 0;
  do {
    puVar1 = dst + lVar4;
    *(undefined4 *)puVar1 = uVar5;
    *(undefined4 *)(puVar1 + 4) = uVar5;
    *(undefined4 *)(puVar1 + 8) = uVar5;
    *(undefined4 *)(puVar1 + 0xc) = uVar5;
    lVar4 = lVar4 + 0x20;
  } while (lVar4 != 0x200);
  return;
}

Assistant:

static void DC16NoTop_SSE2(uint8_t* dst) {  // DC with top samples unavailable
  int DC = 8;
  int j;
  for (j = 0; j < 16; ++j) {
    DC += dst[-1 + j * BPS];
  }
  Put16_SSE2(DC >> 4, dst);
}